

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  long lVar1;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *pSVar2;
  int iVar3;
  int iVar4;
  Node *in_RDI;
  long in_FS_OFFSET;
  Node *next;
  int level;
  Node *x;
  int in_stack_ffffffffffffffc4;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)in_RDI[1].next_[0]._M_b._M_p;
  iVar3 = GetMaxHeight(in_stack_ffffffffffffffd0);
  iVar3 = iVar3 + -1;
  while( true ) {
    local_20 = pSVar2;
    in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
    if (local_20 !=
        (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)in_RDI[1].next_[0]._M_b._M_p) {
      iVar4 = MemTable::KeyComparator::operator()
                        ((KeyComparator *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                         (char *)in_stack_ffffffffffffffd0,(char *)in_RDI);
      in_stack_ffffffffffffffc4 = CONCAT13(iVar4 < 0,(int3)in_stack_ffffffffffffffc4);
    }
    if ((char)((uint)in_stack_ffffffffffffffc4 >> 0x18) == '\0') break;
    in_stack_ffffffffffffffd0 =
         (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
         Node::Next(in_RDI,in_stack_ffffffffffffffc4);
    if ((in_stack_ffffffffffffffd0 ==
         (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)0x0) ||
       (iVar4 = MemTable::KeyComparator::operator()
                          ((KeyComparator *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                           (char *)in_stack_ffffffffffffffd0,(char *)in_RDI),
       pSVar2 = in_stack_ffffffffffffffd0, -1 < iVar4)) {
      if (iVar3 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return (Node *)local_20;
      }
      iVar3 = iVar3 + -1;
      pSVar2 = local_20;
    }
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/skiplist.h"
                ,0x121,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}